

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O1

void __thiscall
TPZManVector<char,_10>::Resize(TPZManVector<char,_10> *this,int64_t newsize,char *object)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  int64_t i;
  long lVar4;
  ulong uVar5;
  double dVar6;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar4 = (this->super_TPZVec<char>).fNElements;
  if (lVar4 != newsize) {
    lVar3 = (this->super_TPZVec<char>).fNAlloc;
    if (lVar3 < newsize) {
      if (newsize < 0xb) {
        if (lVar4 < 1) {
          lVar4 = 0;
        }
        else {
          pcVar2 = (this->super_TPZVec<char>).fStore;
          lVar3 = 0;
          do {
            this->fExtAlloc[lVar3] = pcVar2[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar4 != lVar3);
        }
        if (lVar4 < newsize) {
          do {
            this->fExtAlloc[lVar4] = *object;
            lVar4 = lVar4 + 1;
          } while (newsize != lVar4);
        }
        pcVar2 = (this->super_TPZVec<char>).fStore;
        if (pcVar2 != (char *)0x0 && pcVar2 != this->fExtAlloc) {
          operator_delete__(pcVar2);
        }
        (this->super_TPZVec<char>).fStore = this->fExtAlloc;
        (this->super_TPZVec<char>).fNElements = newsize;
        (this->super_TPZVec<char>).fNAlloc = 10;
      }
      else {
        dVar6 = (double)lVar3 * 1.2;
        uVar5 = (long)dVar6;
        if (dVar6 < (double)newsize) {
          uVar5 = newsize;
        }
        pcVar2 = (char *)operator_new__(uVar5);
        if (lVar4 < 1) {
          lVar4 = 0;
        }
        else {
          pcVar1 = (this->super_TPZVec<char>).fStore;
          lVar3 = 0;
          do {
            pcVar2[lVar3] = pcVar1[lVar3];
            lVar3 = lVar3 + 1;
          } while (lVar4 != lVar3);
        }
        if (newsize - lVar4 != 0 && lVar4 <= newsize) {
          memset(pcVar2 + lVar4,(uint)(byte)*object,newsize - lVar4);
        }
        pcVar1 = (this->super_TPZVec<char>).fStore;
        if (pcVar1 != (char *)0x0 && pcVar1 != this->fExtAlloc) {
          operator_delete__(pcVar1);
        }
        (this->super_TPZVec<char>).fStore = pcVar2;
        (this->super_TPZVec<char>).fNElements = newsize;
        (this->super_TPZVec<char>).fNAlloc = uVar5;
      }
    }
    else {
      if (lVar4 < newsize) {
        do {
          (this->super_TPZVec<char>).fStore[lVar4] = *object;
          lVar4 = lVar4 + 1;
        } while (newsize != lVar4);
      }
      (this->super_TPZVec<char>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}